

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MultiIterNextFrom(Fts5Index *p,Fts5Iter *pIter,i64 iMatch)

{
  long lVar1;
  
  while( true ) {
    fts5MultiIterNext(p,pIter,1,iMatch);
    if ((p->rc != 0) || ((pIter->base).bEof != '\0')) {
      return;
    }
    lVar1 = pIter->aSeg[pIter->aFirst[1].iFirst].iRowid;
    if ((pIter->bRev == 0) && (iMatch <= lVar1)) break;
    if ((pIter->bRev != 0) && (lVar1 <= iMatch)) {
      return;
    }
  }
  return;
}

Assistant:

static void fts5MultiIterNextFrom(
  Fts5Index *p,
  Fts5Iter *pIter,
  i64 iMatch
){
  while( 1 ){
    i64 iRowid;
    fts5MultiIterNext(p, pIter, 1, iMatch);
    if( fts5MultiIterEof(p, pIter) ) break;
    iRowid = fts5MultiIterRowid(pIter);
    if( pIter->bRev==0 && iRowid>=iMatch ) break;
    if( pIter->bRev!=0 && iRowid<=iMatch ) break;
  }
}